

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

int __thiscall
cmCTest::RunTest(cmCTest *this,vector<const_char_*,_std::allocator<const_char_*>_> *argv,
                string *output,int *retVal,ostream *log,double testTimeOut,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *environment,Encoding encoding)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmsysProcess *pcVar2;
  int *piVar3;
  cmCTest *this_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  string *psVar8;
  pointer ppcVar9;
  SaveRestoreEnvironment *pSVar10;
  size_t sVar11;
  pointer __dest;
  pointer ppcVar12;
  char *pcVar13;
  ulong uVar14;
  undefined4 uVar15;
  undefined8 unaff_R13;
  ulong uVar16;
  double dVar17;
  double dVar18;
  undefined8 extraout_XMM0_Qb;
  double dVar19;
  cmProcessOutput processOutput;
  vector<char,_std::allocator<char>_> tempOutput;
  auto_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  int length;
  char *data;
  ostringstream msg;
  string strdata;
  ostringstream cmCTestLog_msg;
  undefined1 auStack_968 [15];
  cmProcessOutput local_959;
  cmsysProcess *local_958;
  string *local_950;
  vector<char,_std::allocator<char>_> local_948;
  auto_ptr<cmSystemTools::SaveRestoreEnvironment> local_930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  int local_904;
  ostream *local_900;
  double local_8f8;
  undefined8 uStack_8f0;
  int *local_8e0;
  vector<char,_std::allocator<char>_> local_8d8;
  char *local_8b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_8b0;
  cmCTest *local_8a8;
  undefined1 local_8a0 [112];
  ios_base local_830 [264];
  string local_728;
  string local_708 [3];
  ios_base local_698 [264];
  undefined1 local_590 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580 [6];
  ios_base local_520 [1016];
  double local_128;
  string *local_b0;
  string *local_a8;
  
  if (environment ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    uVar15 = 0;
  }
  else {
    uVar15 = (undefined4)
             CONCAT71((int7)((ulong)unaff_R13 >> 8),
                      (environment->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start !=
                      (environment->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
  }
  local_958 = (cmsysProcess *)testTimeOut;
  local_950 = output;
  local_900 = log;
  dVar17 = GetRemainingTimeAllowed(this);
  dVar17 = dVar17 + -120.0;
  dVar18 = this->TimeOut;
  dVar19 = dVar18;
  if (dVar17 <= dVar18) {
    dVar19 = dVar17;
  }
  local_8f8 = (double)(~-(ulong)(0.0 < dVar18) & (ulong)dVar17 |
                      (ulong)dVar19 & -(ulong)(0.0 < dVar18));
  uStack_8f0 = extraout_XMM0_Qb;
  if ((0.0 < (double)local_958) &&
     (dVar18 = GetRemainingTimeAllowed(this), (double)local_958 < dVar18)) {
    local_8f8 = (double)local_958;
    uStack_8f0 = 0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_590,"Test timeout computed to be: ",0x1d);
  local_8f8 = (double)(~-(ulong)(0.0 < local_8f8) & 0x3ff0000000000000 |
                      (ulong)local_8f8 & -(ulong)(0.0 < local_8f8));
  poVar7 = std::ostream::_M_insert<double>(local_8f8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__cxx11::stringbuf::str();
  local_958 = (cmsysProcess *)CONCAT44(local_958._4_4_,uVar15);
  local_8e0 = retVal;
  Log(this,4,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x44a,local_708[0]._M_dataplus._M_p,false);
  paVar1 = &local_708[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_708[0]._M_dataplus._M_p,
                    CONCAT71(local_708[0].field_2._M_allocated_capacity._1_7_,
                             local_708[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
  std::ios_base::~ios_base(local_520);
  std::__cxx11::string::string
            ((string *)local_590,
             *(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
              super__Vector_impl_data._M_start,(allocator *)local_708);
  psVar8 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  bVar4 = cmsys::SystemTools::SameFile((string *)local_590,psVar8);
  if (bVar4) {
    bVar4 = this->ForceNewCTestProcess;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._0_8_ != local_580) {
      operator_delete((void *)local_590._0_8_,local_580[0]._M_allocated_capacity + 1);
    }
    if (bVar4 == false) {
      cmCTest((cmCTest *)local_590);
      std::__cxx11::string::_M_assign((string *)(local_590 + 8));
      local_128 = local_8f8;
      local_8b0 = environment;
      local_8a8 = this;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_708);
      local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ppcVar9 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      ppcVar12 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      local_b0 = local_708;
      local_a8 = local_708;
      if (ppcVar12 != ppcVar9) {
        uVar14 = 0;
        uVar16 = 1;
        do {
          pcVar13 = ppcVar9[uVar14];
          if (pcVar13 != (char *)0x0) {
            iVar5 = strcmp(pcVar13,"--build-generator");
            if ((0.0 < local_8f8) && (iVar5 == 0)) {
              local_8a0._0_8_ = local_8a0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_8a0,"--test-timeout","");
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_948,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_8a0);
              if ((undefined1 *)local_8a0._0_8_ != local_8a0 + 0x10) {
                operator_delete((void *)local_8a0._0_8_,local_8a0._16_8_ + 1);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8a0);
              std::ostream::_M_insert<double>(local_8f8);
              std::__cxx11::stringbuf::str();
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_948,&local_928);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_928._M_dataplus._M_p != &local_928.field_2) {
                operator_delete(local_928._M_dataplus._M_p,
                                local_928.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8a0);
              std::ios_base::~ios_base(local_830);
              pcVar13 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar14];
            }
            std::__cxx11::string::string((string *)local_8a0,pcVar13,(allocator *)&local_928);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_948,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8a0);
            if ((undefined1 *)local_8a0._0_8_ != local_8a0 + 0x10) {
              operator_delete((void *)local_8a0._0_8_,local_8a0._16_8_ + 1);
            }
            ppcVar9 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            ppcVar12 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
          }
          bVar4 = uVar16 < (ulong)((long)ppcVar12 - (long)ppcVar9 >> 3);
          uVar14 = uVar16;
          uVar16 = (ulong)((int)uVar16 + 1);
        } while (bVar4);
      }
      poVar7 = local_900;
      if (local_900 != (ostream *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_900,"* Run internal CTest",0x14);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      this_00 = local_8a8;
      piVar3 = local_8e0;
      local_930.x_ = (SaveRestoreEnvironment *)0x0;
      if ((char)local_958 != '\0') {
        pSVar10 = (SaveRestoreEnvironment *)operator_new(0x18);
        cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(pSVar10);
        ::cm::auto_ptr<cmSystemTools::SaveRestoreEnvironment>::reset(&local_930,pSVar10);
        cmSystemTools::AppendEnv(local_8b0);
      }
      iVar5 = Run((cmCTest *)local_590,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_948,local_950);
      *piVar3 = iVar5;
      if (local_950 != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)local_950,local_8a0._0_8_);
        if ((undefined1 *)local_8a0._0_8_ != local_8a0 + 0x10) {
          operator_delete((void *)local_8a0._0_8_,local_8a0._16_8_ + 1);
        }
        if (poVar7 != (ostream *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,(local_950->_M_dataplus)._M_p,local_950->_M_string_length);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_8a0,"Internal cmCTest object used to run test.",0x29);
        std::ios::widen((char)(ostream *)local_8a0 + (char)*(undefined8 *)(local_8a0._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_8a0);
        poVar7 = (ostream *)std::ostream::flush();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(local_950->_M_dataplus)._M_p,local_950->_M_string_length);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this_00,4,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x479,local_928._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_928._M_dataplus._M_p != &local_928.field_2) {
          operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8a0);
        std::ios_base::~ios_base(local_830);
      }
      ::cm::auto_ptr<cmSystemTools::SaveRestoreEnvironment>::~auto_ptr(&local_930);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_948);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_708);
      std::ios_base::~ios_base(local_698);
      ~cmCTest((cmCTest *)local_590);
      return 4;
    }
  }
  else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_590._0_8_ != local_580) {
    operator_delete((void *)local_590._0_8_,local_580[0]._M_allocated_capacity + 1);
  }
  local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (local_950 != (string *)0x0) {
    std::__cxx11::string::_M_replace
              ((ulong)local_950,0,(char *)local_950->_M_string_length,0x66eafa);
  }
  local_930.x_ = (SaveRestoreEnvironment *)0x0;
  if ((char)local_958 != '\0') {
    pSVar10 = (SaveRestoreEnvironment *)operator_new(0x18);
    cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(pSVar10);
    ::cm::auto_ptr<cmSystemTools::SaveRestoreEnvironment>::reset(&local_930,pSVar10);
    cmSystemTools::AppendEnv(environment);
  }
  local_958 = cmsysProcess_New();
  cmsysProcess_SetCommand
            (local_958,
             (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
             super__Vector_impl_data._M_start);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_590,"Command is: ",0xc);
  pcVar13 = *(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if (pcVar13 == (char *)0x0) {
    std::ios::clear((int)auStack_968 + (int)*(undefined8 *)(local_590._0_8_ + -0x18) + 0x3d8);
  }
  else {
    sVar11 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_590,pcVar13,sVar11);
  }
  std::ios::widen((char)(ostream *)local_590 + (char)*(undefined8 *)(local_590._0_8_ + -0x18));
  std::ostream::put((char)local_590);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x48b,local_708[0]._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_708[0]._M_dataplus._M_p,
                    CONCAT71(local_708[0].field_2._M_allocated_capacity._1_7_,
                             local_708[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
  std::ios_base::~ios_base(local_520);
  pcVar2 = local_958;
  if (cmSystemTools::s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(local_958,0,1);
  }
  cmsysProcess_SetTimeout(pcVar2,local_8f8);
  cmsysProcess_Execute(pcVar2);
  cmProcessOutput::cmProcessOutput(&local_959,encoding,0x400);
  local_708[0]._M_string_length = 0;
  local_708[0].field_2._M_local_buf[0] = '\0';
  local_708[0]._M_dataplus._M_p = (pointer)paVar1;
  while (iVar5 = cmsysProcess_WaitForData(local_958,&local_8b8,&local_904,(double *)0x0), iVar5 != 0
        ) {
    cmProcessOutput::DecodeText(&local_959,local_8b8,(long)local_904,local_708,0);
    if (local_950 != (string *)0x0) {
      std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                ((vector<char,std::allocator<char>> *)&local_948,
                 local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_8b8,local_8b8 + local_904);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
    if (local_708[0]._M_string_length != 0) {
      std::ostream::write((char *)local_590,(long)local_708[0]._M_dataplus._M_p);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x49d,(char *)local_8a0._0_8_,false);
    if ((undefined1 *)local_8a0._0_8_ != local_8a0 + 0x10) {
      operator_delete((void *)local_8a0._0_8_,local_8a0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
    std::ios_base::~ios_base(local_520);
    if (local_900 != (ostream *)0x0) {
      std::ostream::write((char *)local_900,(long)local_708[0]._M_dataplus._M_p);
    }
  }
  local_728._M_string_length = 0;
  local_728.field_2._M_local_buf[0] = '\0';
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  cmProcessOutput::DecodeText(&local_959,&local_728,local_708,0);
  poVar7 = local_900;
  pcVar2 = local_958;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p,
                    CONCAT71(local_728.field_2._M_allocated_capacity._1_7_,
                             local_728.field_2._M_local_buf[0]) + 1);
  }
  if (local_708[0]._M_string_length != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
    if (local_708[0]._M_string_length != 0) {
      std::ostream::write(local_590,(long)local_708[0]._M_dataplus._M_p);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x4a5,(char *)local_8a0._0_8_,false);
    if ((undefined1 *)local_8a0._0_8_ != local_8a0 + 0x10) {
      operator_delete((void *)local_8a0._0_8_,local_8a0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
    std::ios_base::~ios_base(local_520);
    if (poVar7 != (ostream *)0x0) {
      std::ostream::write((char *)poVar7,(long)local_708[0]._M_dataplus._M_p);
    }
  }
  cmsysProcess_WaitForExit(pcVar2,(double *)0x0);
  local_8d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_8d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_8d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar14 = (long)local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar14 == 0) {
    __dest = (pointer)0x0;
    sVar11 = 0;
  }
  else {
    if ((long)uVar14 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (pointer)operator_new(uVar14);
    sVar11 = (long)local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  }
  local_8d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __dest + uVar14;
  local_8d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = __dest;
  if (local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_8d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = __dest;
    memmove(__dest,local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar11);
  }
  local_8d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = __dest + sVar11;
  cmProcessOutput::DecodeText(&local_959,&local_8d8,&local_948,0);
  psVar8 = local_950;
  pcVar2 = local_958;
  if (local_8d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_8d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((psVar8 != (string *)0x0) &&
     (local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    std::__cxx11::string::append
              ((char *)psVar8,
               (ulong)local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_590,"-- Process completed",0x14);
  std::ios::widen((char)(ostream *)local_590 + (char)*(undefined8 *)(local_590._0_8_ + -0x18));
  std::ostream::put((char)local_590);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,4,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x4b1,(char *)local_8a0._0_8_,false);
  if ((undefined1 *)local_8a0._0_8_ != local_8a0 + 0x10) {
    operator_delete((void *)local_8a0._0_8_,local_8a0._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
  std::ios_base::~ios_base(local_520);
  iVar5 = cmsysProcess_GetState(pcVar2);
  if (iVar5 == 1) {
    local_8a0._0_8_ = local_8a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8a0,"\n*** ERROR executing: ","");
    cmsysProcess_GetErrorString(pcVar2);
    std::__cxx11::string::append(local_8a0);
    if (psVar8 != (string *)0x0) {
      std::__cxx11::string::_M_append((char *)psVar8,local_8a0._0_8_);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_590,(char *)local_8a0._0_8_,local_8a0._8_8_);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x4cd,local_928._M_dataplus._M_p,false);
  }
  else {
    if (iVar5 != 2) {
      if (iVar5 == 4) {
        iVar6 = cmsysProcess_GetExitValue(pcVar2);
        *local_8e0 = iVar6;
        if ((iVar6 != 0) && (this->OutputTestOutputOnTestFailure == true)) {
          OutputTestErrors(this,&local_948);
        }
      }
      goto LAB_0028c742;
    }
    if (this->OutputTestOutputOnTestFailure == true) {
      OutputTestErrors(this,&local_948);
    }
    iVar6 = cmsysProcess_GetExitException(pcVar2);
    *local_8e0 = iVar6;
    local_8a0._0_8_ = local_8a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8a0,"\n*** Exception executing: ","");
    cmsysProcess_GetExceptionString(pcVar2);
    std::__cxx11::string::append(local_8a0);
    if (psVar8 != (string *)0x0) {
      std::__cxx11::string::_M_append((char *)psVar8,local_8a0._0_8_);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_590,(char *)local_8a0._0_8_,local_8a0._8_8_);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x4c5,local_928._M_dataplus._M_p,false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != &local_928.field_2) {
    operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
  std::ios_base::~ios_base(local_520);
  if ((undefined1 *)local_8a0._0_8_ != local_8a0 + 0x10) {
    operator_delete((void *)local_8a0._0_8_,local_8a0._16_8_ + 1);
  }
LAB_0028c742:
  cmsysProcess_Delete(pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708[0]._M_dataplus._M_p != &local_708[0].field_2) {
    operator_delete(local_708[0]._M_dataplus._M_p,
                    CONCAT71(local_708[0].field_2._M_allocated_capacity._1_7_,
                             local_708[0].field_2._M_local_buf[0]) + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_959);
  ::cm::auto_ptr<cmSystemTools::SaveRestoreEnvironment>::~auto_ptr(&local_930);
  if (local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar5;
}

Assistant:

int cmCTest::RunTest(std::vector<const char*> argv, std::string* output,
                     int* retVal, std::ostream* log, double testTimeOut,
                     std::vector<std::string>* environment, Encoding encoding)
{
  bool modifyEnv = (environment && !environment->empty());

  // determine how much time we have
  double timeout = this->GetRemainingTimeAllowed() - 120;
  if (this->TimeOut > 0 && this->TimeOut < timeout) {
    timeout = this->TimeOut;
  }
  if (testTimeOut > 0 && testTimeOut < this->GetRemainingTimeAllowed()) {
    timeout = testTimeOut;
  }

  // always have at least 1 second if we got to here
  if (timeout <= 0) {
    timeout = 1;
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "Test timeout computed to be: " << timeout << "\n");
  if (cmSystemTools::SameFile(argv[0], cmSystemTools::GetCTestCommand()) &&
      !this->ForceNewCTestProcess) {
    cmCTest inst;
    inst.ConfigType = this->ConfigType;
    inst.TimeOut = timeout;

    // Capture output of the child ctest.
    std::ostringstream oss;
    inst.SetStreams(&oss, &oss);

    std::vector<std::string> args;
    for (unsigned int i = 0; i < argv.size(); ++i) {
      if (argv[i]) {
        // make sure we pass the timeout in for any build and test
        // invocations. Since --build-generator is required this is a
        // good place to check for it, and to add the arguments in
        if (strcmp(argv[i], "--build-generator") == 0 && timeout > 0) {
          args.push_back("--test-timeout");
          std::ostringstream msg;
          msg << timeout;
          args.push_back(msg.str());
        }
        args.push_back(argv[i]);
      }
    }
    if (log) {
      *log << "* Run internal CTest" << std::endl;
    }

    CM_AUTO_PTR<cmSystemTools::SaveRestoreEnvironment> saveEnv;
    if (modifyEnv) {
      saveEnv.reset(new cmSystemTools::SaveRestoreEnvironment);
      cmSystemTools::AppendEnv(*environment);
    }

    *retVal = inst.Run(args, output);
    if (output) {
      *output += oss.str();
    }
    if (log && output) {
      *log << *output;
    }
    if (output) {
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 "Internal cmCTest object used to run test." << std::endl
                                                             << *output
                                                             << std::endl);
    }

    return cmsysProcess_State_Exited;
  }
  std::vector<char> tempOutput;
  if (output) {
    *output = "";
  }

  CM_AUTO_PTR<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  if (modifyEnv) {
    saveEnv.reset(new cmSystemTools::SaveRestoreEnvironment);
    cmSystemTools::AppendEnv(*environment);
  }

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmCTestLog(this, DEBUG, "Command is: " << argv[0] << std::endl);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }

  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while (cmsysProcess_WaitForData(cp, &data, &length, CM_NULLPTR)) {
    processOutput.DecodeText(data, length, strdata);
    if (output) {
      tempOutput.insert(tempOutput.end(), data, data + length);
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }

  cmsysProcess_WaitForExit(cp, CM_NULLPTR);
  processOutput.DecodeText(tempOutput, tempOutput);
  if (output && tempOutput.begin() != tempOutput.end()) {
    output->append(&*tempOutput.begin(), tempOutput.size());
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "-- Process completed"
               << std::endl);

  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    *retVal = cmsysProcess_GetExitValue(cp);
    if (*retVal != 0 && this->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
  } else if (result == cmsysProcess_State_Exception) {
    if (this->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
    *retVal = cmsysProcess_GetExitException(cp);
    std::string outerr = "\n*** Exception executing: ";
    outerr += cmsysProcess_GetExceptionString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr << std::endl
                                                    << std::flush);
  } else if (result == cmsysProcess_State_Error) {
    std::string outerr = "\n*** ERROR executing: ";
    outerr += cmsysProcess_GetErrorString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr << std::endl
                                                    << std::flush);
  }
  cmsysProcess_Delete(cp);

  return result;
}